

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.cpp
# Opt level: O0

void __thiscall jbcoin::SerialIter::getFieldID(SerialIter *this,int *type,int *name)

{
  byte bVar1;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  uint *local_20;
  int *name_local;
  int *type_local;
  SerialIter *this_local;
  
  local_20 = (uint *)name;
  name_local = type;
  type_local = (int *)this;
  bVar1 = get8(this);
  *name_local = (uint)bVar1;
  *local_20 = *name_local & 0xf;
  *name_local = *name_local >> 4;
  if (*name_local == 0) {
    bVar1 = get8(this);
    *name_local = (uint)bVar1;
    if ((*name_local == 0) || (*name_local < 0x10)) {
      std::__cxx11::to_string(&local_60,*name_local);
      std::operator+(&local_40,"gFID: uncommon type out of range ",&local_60);
      Throw<std::runtime_error,std::__cxx11::string>(&local_40);
    }
  }
  if (*local_20 == 0) {
    bVar1 = get8(this);
    *local_20 = (uint)bVar1;
    if ((*local_20 == 0) || ((int)*local_20 < 0x10)) {
      std::__cxx11::to_string(&local_b0,*local_20);
      std::operator+(&local_90,"gFID: uncommon name out of range ",&local_b0);
      Throw<std::runtime_error,std::__cxx11::string>(&local_90);
    }
  }
  return;
}

Assistant:

void
SerialIter::getFieldID (int& type, int& name)
{
    type = get8();
    name = type & 15;
    type >>= 4;

    if (type == 0)
    {
        // uncommon type
        type = get8();
        if (type == 0 || type < 16)
            Throw<std::runtime_error> (
                "gFID: uncommon type out of range " +
                    std::to_string(type));
    }

    if (name == 0)
    {
        // uncommon name
        name = get8();
        if (name == 0 || name < 16)
            Throw<std::runtime_error> (
                "gFID: uncommon name out of range " +
                    std::to_string(name));
    }
}